

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cc
# Opt level: O3

bool woff2::anon_unknown_4::WriteNormalizedLoca(int index_fmt,int num_glyphs,Font *font)

{
  bool bVar1;
  ushort uVar2;
  Table *pTVar3;
  Table *pTVar4;
  ulong uVar5;
  pointer puVar6;
  uint8_t *puVar7;
  byte bVar8;
  long lVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int glyph_index;
  size_t glyph_size;
  uint8_t *glyph_data;
  Glyph glyph;
  ulong local_b0;
  Table *local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_a0;
  pointer local_98;
  ulong local_90;
  Font *local_88;
  size_t local_80;
  uint8_t *local_78;
  Glyph local_70;
  
  pTVar3 = Font::FindTable(font,0x676c7966);
  local_88 = font;
  pTVar4 = Font::FindTable(font,0x6c6f6361);
  local_a0 = &pTVar4->buffer;
  uVar12 = num_glyphs + 1;
  uVar11 = (num_glyphs & 0xfffffffcU) + 4;
  if (0xfffffffc < (uVar12 | 0x80000000)) {
    uVar11 = uVar12;
  }
  bVar8 = 2 - (index_fmt == 0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (local_a0,(long)(int)(uVar11 << (bVar8 & 0x1f)));
  pTVar4->length = uVar12 << (bVar8 & 0x1f);
  local_90 = (ulong)(uint)num_glyphs;
  if (num_glyphs == 0) {
    puVar6 = (local_a0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    puVar6 = (local_a0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < num_glyphs) {
      local_98 = (pTVar3->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      bVar10 = false;
      glyph_index = 0;
      uVar11 = 0;
      lVar9 = 0;
      local_a8 = pTVar4;
      do {
        if (index_fmt == 0) {
          uVar2 = (ushort)(uVar11 >> 1);
          *(ushort *)(puVar6 + lVar9) = uVar2 << 8 | uVar2 >> 8;
          lVar9 = lVar9 + 2;
        }
        else {
          *(uint *)(puVar6 + lVar9) =
               uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
          lVar9 = lVar9 + 4;
        }
        local_70.instructions_size = 0;
        local_70.contours.
        super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_70.contours.
        super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_70.contours.
        super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_70.composite_data_size = 0;
        bVar1 = GetGlyphData(local_88,glyph_index,&local_78,&local_80);
        if ((!bVar1) ||
           ((local_80 != 0 && (bVar1 = ReadGlyph(local_78,local_80,&local_70), !bVar1)))) {
LAB_00108ceb:
          std::
          vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
          ::~vector(&local_70.contours);
          return bVar10;
        }
        uVar13 = (ulong)uVar11;
        local_b0 = (long)(pTVar3->buffer).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)((pTVar3->buffer).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar13);
        bVar1 = StoreGlyph(&local_70,local_98 + uVar13,&local_b0);
        if (!bVar1) goto LAB_00108ceb;
        uVar5 = local_b0 + 3 & 0xfffffffffffffffc;
        if (0xfffffffffffffffc < local_b0) {
          uVar5 = local_b0;
        }
        if (((uVar5 >> 0x20 != 0) ||
            (bVar1 = CARRY4(uVar11,(uint)uVar5), uVar11 = uVar11 + (uint)uVar5, bVar1)) ||
           ((index_fmt == 0 && (0x1ffff < uVar5 + uVar13)))) goto LAB_00108ceb;
        std::
        vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
        ::~vector(&local_70.contours);
        glyph_index = glyph_index + 1;
        bVar10 = (int)local_90 <= glyph_index;
        pTVar4 = local_a8;
      } while (glyph_index != (int)local_90);
      goto LAB_00108cd5;
    }
  }
  bVar10 = true;
  lVar9 = 0;
  uVar11 = 0;
LAB_00108cd5:
  if (index_fmt == 0) {
    uVar2 = (ushort)(uVar11 >> 1);
    *(ushort *)(puVar6 + lVar9) = uVar2 << 8 | uVar2 >> 8;
    lVar9 = lVar9 + 2;
  }
  else {
    *(uint *)(puVar6 + lVar9) =
         uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    lVar9 = lVar9 + 4;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pTVar3->buffer,(ulong)uVar11);
  if (uVar11 == 0) {
    puVar6 = (pointer)0x0;
  }
  else {
    puVar6 = (pTVar3->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  pTVar3->data = puVar6;
  pTVar3->length = uVar11;
  if (lVar9 == 0) {
    puVar7 = (uint8_t *)0x0;
  }
  else {
    puVar7 = (local_a0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  pTVar4->data = puVar7;
  return bVar10;
}

Assistant:

bool WriteNormalizedLoca(int index_fmt, int num_glyphs, Font* font) {
  Font::Table* glyf_table = font->FindTable(kGlyfTableTag);
  Font::Table* loca_table = font->FindTable(kLocaTableTag);

  int glyph_sz = index_fmt == 0 ? 2 : 4;
  loca_table->buffer.resize(Round4(num_glyphs + 1) * glyph_sz);
  loca_table->length = (num_glyphs + 1) * glyph_sz;

  uint8_t* glyf_dst = num_glyphs ? &glyf_table->buffer[0] : NULL;
  uint8_t* loca_dst = &loca_table->buffer[0];
  uint32_t glyf_offset = 0;
  size_t loca_offset = 0;

  for (int i = 0; i < num_glyphs; ++i) {
    StoreLoca(index_fmt, glyf_offset, &loca_offset, loca_dst);
    Glyph glyph;
    const uint8_t* glyph_data;
    size_t glyph_size;
    if (!GetGlyphData(*font, i, &glyph_data, &glyph_size) ||
        (glyph_size > 0 && !ReadGlyph(glyph_data, glyph_size, &glyph))) {
      return FONT_COMPRESSION_FAILURE();
    }
    size_t glyf_dst_size = glyf_table->buffer.size() - glyf_offset;
    if (!StoreGlyph(glyph, glyf_dst + glyf_offset, &glyf_dst_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
    glyf_dst_size = Round4(glyf_dst_size);
    if (glyf_dst_size > std::numeric_limits<uint32_t>::max() ||
        glyf_offset + static_cast<uint32_t>(glyf_dst_size) < glyf_offset ||
        (index_fmt == 0 && glyf_offset + glyf_dst_size >= (1UL << 17))) {
      return FONT_COMPRESSION_FAILURE();
    }
    glyf_offset += glyf_dst_size;
  }

  StoreLoca(index_fmt, glyf_offset, &loca_offset, loca_dst);

  glyf_table->buffer.resize(glyf_offset);
  glyf_table->data = glyf_offset ? &glyf_table->buffer[0] : NULL;
  glyf_table->length = glyf_offset;
  loca_table->data = loca_offset ? &loca_table->buffer[0] : NULL;

  return true;
}